

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void Catch::defaultListTags
               (ostream *out,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags,
               bool isFiltered)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar4;
  size_t sVar5;
  ostream *poVar6;
  pointer this;
  undefined7 in_register_00000011;
  long lVar7;
  char *pcVar8;
  pointer pTVar9;
  string str;
  ReusableStringStream rss;
  Column wrapper;
  string local_110;
  long *local_f0;
  size_t local_e8;
  long local_e0 [2];
  AnsiSkippingString local_d0;
  undefined8 local_a8;
  size_t sStack_a0;
  undefined8 local_98;
  vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *local_90;
  pointer local_88;
  ReusableStringStream local_80;
  Column local_70;
  
  if ((int)CONCAT71(in_register_00000011,isFiltered) == 0) {
    pcVar8 = "All available tags:\n";
    lVar7 = 0x14;
  }
  else {
    pcVar8 = "Tags for matching test cases:\n";
    lVar7 = 0x1e;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar8,lVar7);
  this = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
         super__Vector_impl_data._M_start;
  local_88 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  pTVar9 = this;
  if (this != local_88) {
    paVar1 = &local_d0.m_string.field_2;
    paVar2 = &local_110.field_2;
    paVar3 = &local_70.m_string.m_string.field_2;
    local_90 = tags;
    do {
      pSVar4 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
               getInternal();
      sVar5 = StringStreams::add(&pSVar4->super_StringStreams);
      local_80.m_index = sVar5;
      pSVar4 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
               getInternal();
      poVar6 = (ostream *)
               (pSVar4->super_StringStreams).m_streams.
               super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar5].m_ptr;
      local_80.m_oss = poVar6;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
      *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 2;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
      std::__cxx11::stringbuf::str();
      TagInfo::all_abi_cxx11_(&local_110,this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == paVar2) {
        local_d0.m_string.field_2._8_8_ = local_110.field_2._8_8_;
        local_d0.m_string._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_d0.m_string._M_dataplus._M_p = local_110._M_dataplus._M_p;
      }
      local_d0.m_string.field_2._M_allocated_capacity._1_7_ =
           local_110.field_2._M_allocated_capacity._1_7_;
      local_d0.m_string.field_2._M_local_buf[0] = local_110.field_2._M_local_buf[0];
      local_d0.m_string._M_string_length = local_110._M_string_length;
      local_110._M_string_length = 0;
      local_110.field_2._M_local_buf[0] = '\0';
      local_d0.m_size = 0;
      local_110._M_dataplus._M_p = (pointer)paVar2;
      TextFlow::AnsiSkippingString::preprocessString(&local_d0);
      local_98 = 0;
      sStack_a0 = local_e8;
      local_a8 = 0x46;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.m_string._M_dataplus._M_p == paVar1) {
        local_70.m_string.m_string.field_2._8_8_ = local_d0.m_string.field_2._8_8_;
        local_70.m_string.m_string._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_70.m_string.m_string._M_dataplus._M_p = local_d0.m_string._M_dataplus._M_p;
      }
      local_70.m_string.m_string.field_2._M_allocated_capacity =
           local_d0.m_string.field_2._M_allocated_capacity;
      local_70.m_string.m_string._M_string_length = local_d0.m_string._M_string_length;
      local_d0.m_string._M_string_length = 0;
      local_d0.m_string.field_2._M_allocated_capacity =
           local_d0.m_string.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_70.m_string.m_size = local_d0.m_size;
      local_70.m_initialIndent = 0;
      local_70.m_width = 0x46;
      local_70.m_indent = local_e8;
      local_d0.m_string._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar2) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_f0,local_e8);
      TextFlow::operator<<(poVar6,&local_70);
      local_d0.m_string._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_d0,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.m_string.m_string._M_dataplus._M_p != paVar3) {
        operator_delete(local_70.m_string.m_string._M_dataplus._M_p,
                        local_70.m_string.m_string.field_2._M_allocated_capacity + 1);
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0,local_e0[0] + 1);
      }
      ReusableStringStream::~ReusableStringStream(&local_80);
      this = this + 1;
    } while (this != local_88);
    this = (local_90->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    pTVar9 = (local_90->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl
             .super__Vector_impl_data._M_start;
  }
  local_70.m_string.m_string._M_dataplus._M_p =
       (pointer)(((long)this - (long)pTVar9 >> 3) * 0x6db6db6db6db6db7);
  local_70.m_string.m_string._M_string_length = 0x180b44;
  local_70.m_string.m_string.field_2._M_allocated_capacity = 3;
  operator<<(out,(pluralise *)&local_70);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n\n",2);
  std::ostream::flush();
  return;
}

Assistant:

void defaultListTags( std::ostream& out,
                          std::vector<TagInfo> const& tags,
                          bool isFiltered ) {
        if ( isFiltered ) {
            out << "Tags for matching test cases:\n";
        } else {
            out << "All available tags:\n";
        }

        for ( auto const& tagCount : tags ) {
            ReusableStringStream rss;
            rss << "  " << std::setw( 2 ) << tagCount.count << "  ";
            auto str = rss.str();
            auto wrapper = TextFlow::Column( tagCount.all() )
                               .initialIndent( 0 )
                               .indent( str.size() )
                               .width( CATCH_CONFIG_CONSOLE_WIDTH - 10 );
            out << str << wrapper << '\n';
        }
        out << pluralise(tags.size(), "tag"_sr) << "\n\n" << std::flush;
    }